

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

uint32 __thiscall google::protobuf::io::CodedInputStream::ReadTagFallback(CodedInputStream *this)

{
  long lVar1;
  byte *pbVar2;
  bool bVar3;
  byte *pbVar4;
  int iVar5;
  uint32 uVar7;
  long lVar8;
  uint64 uStack_10;
  int iVar6;
  
  pbVar2 = this->buffer_;
  iVar6 = (int)this->buffer_end_;
  iVar5 = iVar6 - (int)pbVar2;
  if (iVar5 < 10) {
    if (iVar5 < 1) {
      if (iVar6 == (int)pbVar2) {
        if (((0 < this->buffer_size_after_limit_) ||
            (this->total_bytes_read_ == this->current_limit_)) &&
           (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_)) {
          this->legitimate_message_end_ = true;
          return 0;
        }
      }
    }
    else if (-1 < (char)this->buffer_end_[-1]) goto LAB_001da719;
    if ((this->buffer_ == this->buffer_end_) && (bVar3 = Refresh(this), !bVar3)) {
      if (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_) {
        this->legitimate_message_end_ = true;
      }
      else {
        this->legitimate_message_end_ = this->current_limit_ == this->total_bytes_limit_;
      }
      return 0;
    }
    uStack_10 = 0;
    bVar3 = ReadVarint64(this,&uStack_10);
    uVar7 = 0;
    if (bVar3) {
      uVar7 = (uint32)uStack_10;
    }
    return uVar7;
  }
LAB_001da719:
  uVar7 = *pbVar2 & 0x7f;
  if ((char)*pbVar2 < '\0') {
    uVar7 = uVar7 | (pbVar2[1] & 0x7f) << 7;
    if ((char)pbVar2[1] < '\0') {
      uVar7 = uVar7 | (pbVar2[2] & 0x7f) << 0xe;
      if ((char)pbVar2[2] < '\0') {
        uVar7 = uVar7 | (pbVar2[3] & 0x7f) << 0x15;
        if ((char)pbVar2[3] < '\0') {
          pbVar4 = pbVar2 + 5;
          uVar7 = uVar7 | (uint)pbVar2[4] << 0x1c;
          if ((char)pbVar2[4] < '\0') {
            lVar8 = 0;
            do {
              if ((int)lVar8 == 5) {
                return 0;
              }
              lVar1 = lVar8 + 1;
              pbVar2 = pbVar4 + lVar8;
              lVar8 = lVar1;
            } while ((char)*pbVar2 < '\0');
            pbVar4 = pbVar4 + lVar1;
          }
        }
        else {
          pbVar4 = pbVar2 + 4;
        }
      }
      else {
        pbVar4 = pbVar2 + 3;
      }
    }
    else {
      pbVar4 = pbVar2 + 2;
    }
  }
  else {
    pbVar4 = pbVar2 + 1;
  }
  this->buffer_ = pbVar4;
  return uVar7;
}

Assistant:

inline int CodedInputStream::BufferSize() const {
  return buffer_end_ - buffer_;
}